

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

uint GetNgonBoundarySegments
               (ON_MeshFaceList *face_list,uint ngon_fi_count,uint *ngon_fi,uint ngon_boundary_index
               ,NgonNeighbors *ngon_nbr_map,ON_SimpleArray<unsigned_int> *ngon_vi,
               ON_SimpleArray<unsigned_int> *ngon_side)

{
  long lVar1;
  ON_SimpleArray<unsigned_int> *pOVar2;
  NgonNeighbors *pNVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint vi1;
  uint vi0;
  uint local_98 [5];
  uint local_84;
  uint local_80;
  uint local_7c;
  ON_SimpleArray<unsigned_int> *local_78;
  ulong local_70;
  undefined8 local_68;
  uint *local_60;
  uint local_54;
  uint local_50;
  int local_4c;
  ulong local_48;
  ON_MeshFaceList *local_40;
  NgonNeighbors *local_38;
  
  uVar6 = (ulong)ngon_boundary_index;
  local_60 = ngon_fi;
  uVar8 = 0;
  uVar9 = 0;
  if (ngon_nbr_map != (NgonNeighbors *)0x0 && (ngon_fi != (uint *)0x0 && ngon_fi_count != 0)) {
    local_78 = ngon_vi;
    if (ngon_fi_count == 1) {
      uVar9 = uVar8;
      if ((((ngon_nbr_map->m_NFS[0] == 0) && (ngon_nbr_map->m_NFS[1] == 0)) &&
          (ngon_nbr_map->m_NFS[2] == 0)) && (ngon_nbr_map->m_NFS[3] == 0)) {
        if (*ngon_fi < face_list->m_face_count) {
          puVar5 = face_list->m_faces;
          uVar10 = (ulong)(*ngon_fi * face_list->m_face_stride);
          local_98[1] = puVar5[uVar10 + 1];
          local_98[0] = puVar5[uVar10];
          local_98[3] = puVar5[uVar10 + 2];
          if (face_list->m_bQuadFaces == true) {
            local_98[3] = puVar5[uVar10 + 3];
          }
          local_98[2] = puVar5[uVar10 + 2];
        }
        else {
          local_98[0] = 0;
          local_98[1] = 0;
          local_98[2] = 0;
          local_98[3] = 0;
        }
        if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(ngon_vi,local_98);
        }
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar5 = 0;
        }
        ngon_nbr_map->m_NFS[0] = uVar6 * 8 + 1;
        if (ngon_vi != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(ngon_vi,local_98 + 1);
        }
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar5 = 1;
        }
        pOVar2 = local_78;
        uVar9 = ngon_boundary_index + 2;
        ngon_nbr_map->m_NFS[1] = (ulong)(ngon_boundary_index + 1) * 8 + 1;
        if (local_98[2] != local_98[3]) {
          if (local_78 != (ON_SimpleArray<unsigned_int> *)0x0) {
            ON_SimpleArray<unsigned_int>::Append(local_78,local_98 + 2);
          }
          if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
            puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
            *puVar5 = 2;
          }
          uVar6 = (ulong)uVar9;
          uVar9 = ngon_boundary_index + 3;
          ngon_nbr_map->m_NFS[2] = uVar6 * 8 + 1;
        }
        if (pOVar2 != (ON_SimpleArray<unsigned_int> *)0x0) {
          ON_SimpleArray<unsigned_int>::Append(pOVar2,local_98 + 3);
        }
        if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
          puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
          *puVar5 = 3;
        }
        ngon_nbr_map->m_NFS[3] = (ulong)uVar9 * 8 + 1;
        uVar9 = (uVar9 - ngon_boundary_index) + 1;
      }
    }
    else {
      puVar5 = face_list->m_faces;
      local_40 = face_list;
      local_68 = CONCAT44(in_register_00000034,ngon_fi_count);
      iVar12 = 0;
      local_38 = ngon_nbr_map;
      uVar10 = 0;
      uVar9 = 0;
      do {
        if (ngon_fi[uVar10] < face_list->m_face_count) {
          uVar4 = (ulong)(ngon_fi[uVar10] * face_list->m_face_stride);
          local_98[1] = puVar5[uVar4 + 1];
          local_98[0] = puVar5[uVar4];
          local_98[3] = puVar5[uVar4 + 2];
          if ((face_list->m_bQuadFaces & 1U) != 0) {
            local_98[3] = puVar5[uVar4 + 3];
          }
          local_98[2] = puVar5[uVar4 + 2];
        }
        else {
          local_98[0] = 0;
          local_98[1] = 0;
          local_98[2] = 0;
          local_98[3] = 0;
        }
        lVar11 = 0;
        do {
          lVar1 = lVar11 + 1;
          if ((local_98[lVar11] != local_98[(uint)lVar1 & 3]) && (ngon_nbr_map->m_NFS[lVar11] == 0))
          {
            ngon_nbr_map->m_NFS[lVar11] = uVar6 * 8 + 1;
            if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
              puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
              *puVar5 = (int)lVar11 - iVar12;
            }
            pOVar2 = local_78;
            uVar9 = (int)local_68 * 2 + 2;
            local_7c = local_98[lVar11];
            uVar4 = (ulong)((int)lVar11 + 1U & 3);
            local_84 = local_98[uVar4];
            if (local_78 != (ON_SimpleArray<unsigned_int> *)0x0) {
              ON_SimpleArray<unsigned_int>::Append(local_78,&local_7c);
              ON_SimpleArray<unsigned_int>::Append(pOVar2,&local_84);
            }
            if (uVar9 == 0) {
              return 0;
            }
            local_54 = uVar9;
            local_50 = (int)local_68 * 2 - 1;
            uVar9 = ngon_boundary_index + 1;
            local_80 = 0;
            local_70 = uVar6;
            do {
              pNVar3 = local_38;
              local_48 = uVar10;
              local_4c = (int)uVar10 * 8;
              iVar12 = 4;
              while (uVar6 = pNVar3[uVar10 & 0xffffffff].m_NFS[uVar4], uVar6 == 0) {
                uVar6 = (ulong)((int)uVar4 + 1U & 3);
                uVar8 = local_98[uVar6];
                if (local_84 != uVar8) {
                  pNVar3[uVar10 & 0xffffffff].m_NFS[uVar4] = (ulong)uVar9 * 8 + 1;
                  if (ngon_side != (ON_SimpleArray<unsigned_int> *)0x0) {
                    uVar7 = (int)uVar4 + local_4c;
                    puVar5 = ON_SimpleArray<unsigned_int>::AppendNew(ngon_side);
                    *puVar5 = uVar7;
                  }
                  uVar9 = uVar9 + 1;
                  local_84 = uVar8;
                  if (local_7c == uVar8) {
                    if (2 < uVar9 - (int)local_70) {
                      return uVar9 - (int)local_70;
                    }
                    return 0;
                  }
                  if (local_78 != (ON_SimpleArray<unsigned_int> *)0x0) {
                    ON_SimpleArray<unsigned_int>::Append(local_78,&local_84);
                  }
                }
                iVar12 = iVar12 + -1;
                uVar4 = uVar6;
                if (iVar12 == 0) {
                  return 0;
                }
              }
              if ((uVar6 & 4) == 0) {
                return 0;
              }
              uVar10 = uVar6 >> 3;
              if ((uint)local_48 == (uint)uVar10) {
                return 0;
              }
              if ((uint)local_68 <= (uint)uVar10) {
                return 0;
              }
              if (local_60[uVar10 & 0xffffffff] < local_40->m_face_count) {
                puVar5 = local_40->m_faces;
                uVar4 = (ulong)(local_60[uVar10 & 0xffffffff] * local_40->m_face_stride);
                local_98[1] = puVar5[uVar4 + 1];
                local_98[0] = puVar5[uVar4];
                local_98[3] = puVar5[uVar4 + 2];
                if (local_40->m_bQuadFaces == true) {
                  local_98[3] = puVar5[uVar4 + 3];
                }
                local_98[2] = puVar5[uVar4 + 2];
              }
              else {
                local_98[0] = 0;
                local_98[1] = 0;
                local_98[2] = 0;
                local_98[3] = 0;
              }
              uVar4 = (ulong)((int)uVar6 + 1U & 3);
              if (local_84 != local_98[uVar4]) {
                return 0;
              }
              local_80 = local_80 + 1;
              if (local_50 < local_80) {
                return 0;
              }
            } while (uVar9 - (int)local_70 <= local_54);
            return 0;
          }
          lVar11 = lVar1;
        } while (lVar1 != 4);
        uVar10 = uVar10 + 1;
        ngon_nbr_map = ngon_nbr_map + 1;
        iVar12 = iVar12 + -8;
      } while (uVar10 != ngon_fi_count);
    }
  }
  return uVar9;
}

Assistant:

static unsigned int GetNgonBoundarySegments(
  const ON_MeshFaceList& face_list,
  unsigned int ngon_fi_count,
  const unsigned int* ngon_fi,
  unsigned int ngon_boundary_index,
  struct NgonNeighbors* ngon_nbr_map,
  ON_SimpleArray<unsigned int>* ngon_vi,
  ON_SimpleArray<unsigned int>* ngon_side
  )
{
  unsigned int j0, next_j0, j1;
  unsigned int Fvi[4];
  unsigned int vi0, vi1, fi, max_vertex_count;
  unsigned int ngon_fdex, nbr_ngon_fdex, face_vist_count, max_face_visit_count;

  const unsigned int ngon_boundary_index0 = ngon_boundary_index;

  if ( ngon_fi_count <= 0 || 0 == ngon_fi || 0 == ngon_nbr_map )
    return 0;

  if ( 1 == ngon_fi_count )
  {
    if (    0 != ngon_nbr_map[0].m_NFS[0] 
         || 0 != ngon_nbr_map[0].m_NFS[1] 
         || 0 != ngon_nbr_map[0].m_NFS[2] 
         || 0 != ngon_nbr_map[0].m_NFS[3] 
         )
    {
      return 0;
    }
    face_list.QuadFvi(ngon_fi[0],Fvi);

    if ( ngon_vi )
      ngon_vi->Append(Fvi[0]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,0,false);
    ngon_nbr_map[0].m_NFS[0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    if ( ngon_vi )
      ngon_vi->Append(Fvi[1]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,1,false);
    ngon_nbr_map[0].m_NFS[1] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    if ( Fvi[2] != Fvi[3] )
    {
      if ( ngon_vi )
        ngon_vi->Append(Fvi[2]);
      if ( ngon_side )
        ngon_side->AppendNew() = EncodeNgonSide(0,2,false);
      ngon_nbr_map[0].m_NFS[2] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
    }

    if ( ngon_vi )
      ngon_vi->Append(Fvi[3]);
    if ( ngon_side )
      ngon_side->AppendNew() = EncodeNgonSide(0,3,false);
    ngon_nbr_map[0].m_NFS[3] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);

    return ngon_boundary_index - ngon_boundary_index0;
  }


  fi = 0;  // keep lint quiet - at this point ngon_fi_count > 0
  j0 = 0;  // keep lint quiet - at this point ngon_fi_count > 0
  
  // find a boundary edge
  for ( ngon_fdex = 0; ngon_fdex < ngon_fi_count; ngon_fdex++ )
  {
    fi = ngon_fi[ngon_fdex];
    face_list.QuadFvi(fi,Fvi);
    for ( j0 = 0; j0 < 4; j0++ )
    {
      if ( Fvi[j0] == Fvi[(j0+1)%4] )
        continue;
      if ( 0 != ngon_nbr_map[ngon_fdex].m_NFS[j0] )
        continue; // has a neighbor or is part of a previously found boundary component when holes are allowed

      // we being at the vertex with index Fvi[j]
      break;
    }    
    if ( j0 < 4 )
      break;
  }
  
  if ( ngon_fdex >= ngon_fi_count )
    return 0;

  // max_vertex_count is used to prevent infinite recursion
  // when the mesh information is not valid or there is
  // a bug in this code.  The maximum value occurs
  // for a strip of quads.
  max_vertex_count = 2*ngon_fi_count + 2;


  // max_face_visit_count is used to prevent infinite recursion
  // when the mesh information is not valid or there is
  // a bug in this code.  The maximum value occurs
  // for a strip of quads when the initial face is
  // at the end of a strip.
  max_face_visit_count = 2*ngon_fi_count - 1;

  ngon_nbr_map[ngon_fdex].m_NFS[j0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
  if ( ngon_side )
    ngon_side->AppendNew() = EncodeNgonSide(ngon_fdex,j0,false);

  vi0 = Fvi[j0];
  j0 = (j0+1)%4;
  vi1 = Fvi[j0];
  if ( ngon_vi )
  {
    ngon_vi->Append(vi0);
    ngon_vi->Append(vi1);
  }
  for ( face_vist_count = 0;
        face_vist_count <= max_face_visit_count && ngon_boundary_index - ngon_boundary_index0 <= max_vertex_count;
        face_vist_count++ 
      )
  {
    for (j1 = 0; j1 < 4; j1++, j0 = next_j0 )
    {
      if ( 0 != ngon_nbr_map[ngon_fdex].m_NFS[j0] )
        break; // has a neighbor or is a boundary

      next_j0 = (j0+1)%4;
      if ( vi1 == Fvi[next_j0] )
        continue; // skip over duplicate vertex in triangles

      ngon_nbr_map[ngon_fdex].m_NFS[j0] = EncodeNFS_BoundaryIndex(ngon_boundary_index++);
      if ( ngon_side )
        ngon_side->AppendNew() = EncodeNgonSide(ngon_fdex,j0,false);

      vi1 = Fvi[next_j0];
      if ( vi0 == vi1 )
      {
        // this is where successful searches end with (ngon_vi.Count() >= 3)
        if ( ngon_boundary_index - ngon_boundary_index0 >= 3 )
        {
          return ngon_boundary_index - ngon_boundary_index0;
        }
        return 0;
      }
      if ( ngon_vi )
        ngon_vi->Append(vi1);
    }

    if ( j1 >= 4 )
      break; // not expected - there is a bug or a bogus mesh

    if ( false == IsNFS_Neighbor(ngon_nbr_map[ngon_fdex].m_NFS[j0]) )
      break; // not expected - there is a bug or a bogus mesh

    // switch to neighbor face;
    nbr_ngon_fdex = (unsigned int)DecodeNFS_NgonFaceIndex(ngon_nbr_map[ngon_fdex].m_NFS[j0]);

    if ( nbr_ngon_fdex == ngon_fdex || nbr_ngon_fdex >= ngon_fi_count )
    {
      // Unexpected - bail rather than crash.
      // This means there is a bug in the code that 
      // set the values in the ngon_nbr_map[] array.
      // The same face may be visited multiple times (strip of quads for example),
      // but a face can never be its own neighbor.
      break;
    }

    // move onto the neighbor
    j0 = DecodeNFS_EdgeIndex(ngon_nbr_map[ngon_fdex].m_NFS[j0]);

    ngon_fdex = nbr_ngon_fdex;
    fi = ngon_fi[ngon_fdex];
    face_list.QuadFvi(fi,Fvi);
    // faces have compatible orientations 
    // (The shared edge is reversed when going to neighboring face)
    j0 = (j0+1)%4; // move the the vertex at the end of the shared edge

    if ( vi1 != Fvi[j0] )
    {
      // not expected - there is a bug or a bogus mesh
      break;
    }
  }

  return 0;
}